

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConveyor.cpp
# Opt level: O3

void __thiscall chrono::ChConveyor::Update(ChConveyor *this,double mytime,bool update_assets)

{
  _func_int **pp_Var1;
  undefined1 auVar2 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  element_type *peVar7;
  undefined7 in_register_00000031;
  ChBody *pCVar8;
  ChLinkLockLock *pCVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ChVector<double> v;
  ChVector<double> local_38;
  
  ChPhysicsItem::Update(&this->super_ChPhysicsItem,mytime,update_assets);
  (*(this->conveyor_truss->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x13])
            (mytime,this->conveyor_truss,CONCAT71(in_register_00000031,update_assets) & 0xffffffff);
  bVar6 = ChBody::GetBodyFixed(this->conveyor_truss);
  if (bVar6) {
    ChVariablesBodyOwnMass::SetBodyMass(&this->conveyor_plate->variables,100000.0);
    local_38.m_data[0] = 100000.0;
    local_38.m_data[1] = 100000.0;
    local_38.m_data[2] = 100000.0;
    ChBody::SetInertiaXX(this->conveyor_plate,&local_38);
    pCVar8 = this->conveyor_plate;
    local_38.m_data[2] = 0.0;
    local_38.m_data[0] = 0.0;
    local_38.m_data[1] = 0.0;
  }
  else {
    ChVariablesBodyOwnMass::SetBodyMass
              (&this->conveyor_plate->variables,(this->conveyor_truss->variables).mass);
    pCVar8 = this->conveyor_plate;
    ChBody::GetInertiaXX(this->conveyor_truss);
    ChBody::SetInertiaXX(pCVar8,&local_38);
    pCVar8 = this->conveyor_plate;
    ChBody::GetInertiaXY(this->conveyor_truss);
  }
  ChBody::SetInertiaXY(pCVar8,&local_38);
  ChFrame<double>::SetCoord
            ((ChFrame<double> *)&this->conveyor_plate->super_ChBodyFrame,
             &(this->conveyor_truss->super_ChBodyFrame).super_ChFrameMoving<double>.
              super_ChFrame<double>.coord);
  (*(this->conveyor_plate->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
    _vptr_ChFrame[6])(&this->conveyor_plate->super_ChBodyFrame,
                      &(this->conveyor_truss->super_ChBodyFrame).super_ChFrameMoving<double>.
                       coord_dt);
  pCVar8 = this->conveyor_truss;
  auVar15._8_8_ = this->conveyor_speed;
  auVar15._0_8_ = this->conveyor_speed;
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (pCVar8->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (pCVar8->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar14 = vmovhpd_avx(auVar16,(pCVar8->super_ChBodyFrame).super_ChFrameMoving<double>.
                                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[4]);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (pCVar8->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (pCVar8->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] * 0.0;
  auVar10 = vfmadd231sd_fma(auVar13,auVar15,auVar10);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (pCVar8->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
                 Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar13 = vfmadd231sd_fma(auVar10,ZEXT816(0) << 0x40,auVar2);
  auVar17._0_8_ = auVar14._0_8_ * 0.0;
  auVar17._8_8_ = auVar14._8_8_ * 0.0;
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (pCVar8->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar10 = vmovhpd_avx(auVar14,(pCVar8->super_ChBodyFrame).super_ChFrameMoving<double>.
                                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[3]);
  auVar2 = vfmadd213pd_fma(auVar10,auVar15,auVar17);
  auVar10 = vmovhpd_avx(auVar18,(pCVar8->super_ChBodyFrame).super_ChFrameMoving<double>.
                                super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[5]);
  auVar10 = vfmadd213pd_fma(auVar10,ZEXT816(0) << 0x40,auVar2);
  local_38.m_data[0] =
       auVar10._0_8_ +
       (pCVar8->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
       m_data[0] + (pCVar8->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[0];
  local_38.m_data[1] =
       auVar10._8_8_ +
       (pCVar8->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
       m_data[1] + (pCVar8->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[1];
  local_38.m_data[2] =
       auVar13._0_8_ +
       (pCVar8->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
       m_data[2] + (pCVar8->super_ChBodyFrame).super_ChFrameMoving<double>.coord_dt.pos.m_data[2];
  (*(this->conveyor_plate->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.
    _vptr_ChFrame[7])(&this->conveyor_plate->super_ChBodyFrame);
  (*(this->conveyor_plate->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x13])
            (mytime,this->conveyor_plate,update_assets);
  pCVar9 = this->internal_link;
  peVar7 = (pCVar9->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = (pCVar9->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = this->conveyor_speed;
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar10 = vxorpd_avx512vl(auVar11,auVar5);
    pp_Var1 = (_func_int **)vmovlpd_avx(auVar10);
    peVar7[2]._vptr_ChFunction = pp_Var1;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') goto LAB_0053f323;
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
LAB_0053f323:
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
    auVar12._8_8_ = 0;
    auVar12._0_8_ = this->conveyor_speed;
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar10 = vxorpd_avx512vl(auVar12,auVar4);
    pp_Var1 = (_func_int **)vmovlpd_avx(auVar10);
    peVar7[2]._vptr_ChFunction = pp_Var1;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    pCVar9 = this->internal_link;
    peVar7 = (pCVar9->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var3 = (pCVar9->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded != '\0') goto LAB_0053f38d;
        LOCK();
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
LAB_0053f38d:
        p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      }
      peVar7[1]._vptr_ChFunction =
           (_func_int **)(this->conveyor_speed * (this->super_ChPhysicsItem).super_ChObj.ChTime);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      pCVar9 = this->internal_link;
      goto LAB_0053f3b7;
    }
  }
  peVar7[1]._vptr_ChFunction =
       (_func_int **)(this->conveyor_speed * (this->super_ChPhysicsItem).super_ChObj.ChTime);
LAB_0053f3b7:
  (**(code **)((long)(pCVar9->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
                     super_ChPhysicsItem.super_ChObj._vptr_ChObj + 0x98))
            (mytime,pCVar9,update_assets);
  return;
}

Assistant:

void ChConveyor::Update(double mytime, bool update_assets) {
    // inherit parent class function
    ChPhysicsItem::Update(mytime, update_assets);

    conveyor_truss->Update(mytime, update_assets);

    if (conveyor_truss->GetBodyFixed()) {
        double largemass = 100000;
        conveyor_plate->SetMass(largemass);
        conveyor_plate->SetInertiaXX(ChVector<>(largemass, largemass, largemass));
        conveyor_plate->SetInertiaXY(ChVector<>(0, 0, 0));
    } else {
        conveyor_plate->SetMass(conveyor_truss->GetMass());
        conveyor_plate->SetInertiaXX(conveyor_truss->GetInertiaXX());
        conveyor_plate->SetInertiaXY(conveyor_truss->GetInertiaXY());
    }

    // keep the plate always at the same position of the main reference
    conveyor_plate->SetCoord(conveyor_truss->GetCoord());
    conveyor_plate->SetCoord_dt(conveyor_truss->GetCoord_dt());
    // keep the plate always at the same speed of the main reference, plus the conveyor speed on X local axis
    conveyor_plate->SetPos_dt(conveyor_truss->GetPos_dt() + (ChVector<>(conveyor_speed, 0, 0) >> (*conveyor_truss)));

    conveyor_plate->Update(mytime, update_assets);

    std::static_pointer_cast<ChFunction_Ramp>(internal_link->GetMotion_X())->Set_ang(-conveyor_speed);
    // always zero pos. offset (trick):
    std::static_pointer_cast<ChFunction_Ramp>(internal_link->GetMotion_X())->Set_y0(+conveyor_speed * GetChTime());

    internal_link->Update(mytime, update_assets);
}